

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall YAML::Parser::HandleTagDirective(Parser *this,Token *token)

{
  key_type *__k;
  Directives *pDVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  Exception *pEVar4;
  string local_40;
  
  __k = (token->params).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(token->params).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)__k != 0x40) {
    pEVar4 = (Exception *)__cxa_allocate_exception(0x40);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"TAG directives must have exactly two arguments","");
    Exception::Exception(pEVar4,&token->mark,&local_40);
    *(undefined ***)pEVar4 = &PTR__BadFile_008899d0;
    __cxa_throw(pEVar4,&ParserException::typeinfo,BadFile::~BadFile);
  }
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(((this->m_pDirectives)._M_t.
                    super___uniq_ptr_impl<YAML::Directives,_std::default_delete<YAML::Directives>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_YAML::Directives_*,_std::default_delete<YAML::Directives>_>
                    .super__Head_base<0UL,_YAML::Directives_*,_false>._M_head_impl)->tags)._M_t,__k)
  ;
  pDVar1 = (this->m_pDirectives)._M_t.
           super___uniq_ptr_impl<YAML::Directives,_std::default_delete<YAML::Directives>_>._M_t.
           super__Tuple_impl<0UL,_YAML::Directives_*,_std::default_delete<YAML::Directives>_>.
           super__Head_base<0UL,_YAML::Directives_*,_false>._M_head_impl;
  if (iVar2._M_node == (_Base_ptr)((long)&(pDVar1->tags)._M_t + 8U)) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pDVar1->tags,__k);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    return;
  }
  pEVar4 = (Exception *)__cxa_allocate_exception(0x40);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"repeated TAG directive","");
  Exception::Exception(pEVar4,&token->mark,&local_40);
  *(undefined ***)pEVar4 = &PTR__BadFile_008899d0;
  __cxa_throw(pEVar4,&ParserException::typeinfo,BadFile::~BadFile);
}

Assistant:

void Parser::HandleTagDirective(const Token& token) {
  if (token.params.size() != 2)
    throw ParserException(token.mark, ErrorMsg::TAG_DIRECTIVE_ARGS);

  const std::string& handle = token.params[0];
  const std::string& prefix = token.params[1];
  if (m_pDirectives->tags.find(handle) != m_pDirectives->tags.end()) {
    throw ParserException(token.mark, ErrorMsg::REPEATED_TAG_DIRECTIVE);
  }

  m_pDirectives->tags[handle] = prefix;
}